

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O2

void __thiscall tcu::ThreadUtil::MessageBuilder::operator<<(MessageBuilder *this,EndToken *param_1)

{
  Thread *this_00;
  string local_30;
  
  this_00 = this->m_thread;
  std::__cxx11::stringbuf::str();
  Thread::pushMessage(this_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void MessageBuilder::operator<< (const EndToken&)
{
	m_thread.pushMessage(m_stream.str());
}